

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

void CaDiCaL::Options::initialize_from_environment(int *val,char *name,int L,int H)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined1 *puVar6;
  char *pcVar7;
  char key [80];
  char local_78 [8];
  undefined1 auStack_70 [72];
  
  cVar2 = 'C';
  lVar5 = 0;
  do {
    local_78[lVar5] = cVar2;
    cVar2 = "CADICAL_"[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  puVar6 = auStack_70;
  cVar2 = *name;
  if (cVar2 != '\0') {
    pcVar7 = name + 1;
    do {
      iVar4 = toupper((int)cVar2);
      *puVar6 = (char)iVar4;
      puVar6 = puVar6 + 1;
      cVar2 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar2 != '\0');
  }
  *puVar6 = 0;
  pcVar7 = getenv(local_78);
  if (pcVar7 != (char *)0x0) {
    bVar3 = parse_int_str(pcVar7,val);
    if (bVar3) {
      iVar4 = *val;
      iVar1 = L;
      if (L < iVar4) {
        iVar1 = iVar4;
      }
      if (iVar4 < L || H < iVar1) {
        if (iVar1 < H) {
          H = iVar1;
        }
        *val = H;
      }
    }
  }
  return;
}

Assistant:

void Options::initialize_from_environment (int &val, const char *name,
                                           const int L, const int H) {
  char key[80], *q;
  const char *p;
  assert (strlen (name) + strlen ("CADICAL_") + 1 < sizeof (key));
  for (p = "CADICAL_", q = key; *p; p++)
    *q++ = *p;
  for (p = name; *p; p++)
    *q++ = toupper (*p);
  assert (q < key + sizeof (key));
  *q = 0;
  const char *val_str = getenv (key);
  if (!val_str)
    return;
  if (!parse_int_str (val_str, val))
    return;
  if (val < L)
    val = L;
  if (val > H)
    val = H;
}